

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestVariableScope::Run(ParserTestVariableScope *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  string local_48;
  
  iVar3 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "foo = bar\nrule cmd\n  command = cmd $foo $in $out\n\nbuild inner: cmd a\n  foo = baz\nbuild outer: cmd b\n\n"
            );
  if (iVar3 == g_current_test->assertion_failures_) {
    bVar2 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_ParserTest).state.edges_.
                             super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->super_ParserTest).state.edges_.
                             super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0xb7,"2u == state.edges_.size()");
    pTVar1 = g_current_test;
    if (bVar2) {
      Edge::EvaluateCommand_abi_cxx11_
                (&local_48,
                 *(this->super_ParserTest).state.edges_.
                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_start,false);
      iVar3 = std::__cxx11::string::compare((char *)&local_48);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xb8,"\"cmd baz a inner\" == state.edges_[0]->EvaluateCommand()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pTVar1 = g_current_test;
      Edge::EvaluateCommand_abi_cxx11_
                (&local_48,
                 (this->super_ParserTest).state.edges_.
                 super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data
                 ._M_start[1],false);
      iVar3 = std::__cxx11::string::compare((char *)&local_48);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xb9,"\"cmd bar b outer\" == state.edges_[1]->EvaluateCommand()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, VariableScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"foo = bar\n"
"rule cmd\n"
"  command = cmd $foo $in $out\n"
"\n"
"build inner: cmd a\n"
"  foo = baz\n"
"build outer: cmd b\n"
"\n"  // Extra newline after build line tickles a regression.
));

  ASSERT_EQ(2u, state.edges_.size());
  EXPECT_EQ("cmd baz a inner", state.edges_[0]->EvaluateCommand());
  EXPECT_EQ("cmd bar b outer", state.edges_[1]->EvaluateCommand());
}